

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilterOperations.cpp
# Opt level: O1

void __thiscall
helics::RandomDropFilterOperation::RandomDropFilterOperation(RandomDropFilterOperation *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  _Any_data local_38;
  code *local_28;
  code *pcStack_20;
  
  (this->super_FilterOperations)._vptr_FilterOperations =
       (_func_int **)&PTR__RandomDropFilterOperation_00527a78;
  (this->dropProb).super___atomic_float<double>._M_fp = 0.0;
  (this->tcond).super___shared_ptr<helics::MessageConditionalOperator,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  p_Var1 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x38);
  p_Var1->_M_use_count = 1;
  p_Var1->_M_weak_count = 1;
  p_Var1->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00527d30;
  local_38._8_8_ = 0;
  pcStack_20 = std::
               _Function_handler<bool_(const_helics::Message_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/FilterOperations.cpp:290:56)>
               ::_M_invoke;
  local_28 = std::
             _Function_handler<bool_(const_helics::Message_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/FilterOperations.cpp:290:56)>
             ::_M_manager;
  local_38._M_unused._M_object = this;
  MessageConditionalOperator::MessageConditionalOperator
            ((MessageConditionalOperator *)(p_Var1 + 1),
             (function<bool_(const_helics::Message_*)> *)&local_38);
  if (local_28 != (code *)0x0) {
    (*local_28)((_Any_data *)&local_38,(_Any_data *)&local_38,__destroy_functor);
  }
  (this->tcond).super___shared_ptr<helics::MessageConditionalOperator,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var1;
  (this->tcond).super___shared_ptr<helics::MessageConditionalOperator,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (MessageConditionalOperator *)(p_Var1 + 1);
  return;
}

Assistant:

RandomDropFilterOperation::RandomDropFilterOperation():
    tcond(std::make_shared<MessageConditionalOperator>([this](const Message* /*unused*/) {
        return (randDouble(RandomDistributions::BERNOULLI, (1.0 - dropProb), 1.0) > 0.1);
    }))
{
}